

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# walletload_tests.cpp
# Opt level: O3

void __thiscall
wallet::walletload_tests::wallet_load_descriptors::test_method(wallet_load_descriptors *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  long lVar2;
  Chain *pCVar3;
  string message;
  MockableData records;
  MockableData records_00;
  MatchFn match;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var4;
  element_type *peVar5;
  readonly_property<bool> rVar6;
  readonly_property65 rVar7;
  CWallet *pCVar8;
  iterator pvVar9;
  iterator pvVar10;
  long in_FS_OFFSET;
  shared_ptr<Descriptor> descriptor;
  const_string file;
  const_string file_00;
  const_string file_01;
  shared_ptr<Descriptor> descriptor_00;
  const_string file_02;
  const_string file_03;
  const_string file_04;
  const_string msg;
  const_string msg_00;
  const_string msg_01;
  const_string msg_02;
  const_string msg_03;
  const_string msg_04;
  check_type cVar11;
  int32_t in_stack_fffffffffffffc18;
  undefined4 in_stack_fffffffffffffc1c;
  undefined8 in_stack_fffffffffffffc20;
  undefined8 in_stack_fffffffffffffc28;
  undefined8 in_stack_fffffffffffffc30;
  undefined8 in_stack_fffffffffffffc38;
  size_t in_stack_fffffffffffffc40;
  undefined4 in_stack_fffffffffffffc48;
  undefined4 in_stack_fffffffffffffc4c;
  _Invoker_type in_stack_fffffffffffffc50;
  char *local_3a0;
  char *local_398;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_390;
  char *local_388;
  char *local_380;
  undefined1 *local_378;
  undefined1 *local_370;
  char *local_368;
  char *local_360;
  DummyDescriptor *local_358;
  element_type *peStack_350;
  bool *local_348;
  undefined8 local_340;
  code *local_338;
  code *local_330;
  bool found;
  DBErrors local_324;
  undefined1 *local_320;
  undefined1 *local_318;
  char *local_310;
  char *local_308;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_300;
  char *local_2f8;
  char *local_2f0;
  undefined1 *local_2e8;
  undefined1 *local_2e0;
  char *local_2d8;
  char *local_2d0;
  char *local_2c8;
  char *local_2c0;
  shared_ptr<wallet::CWallet> wallet_1;
  assertion_result local_2a8;
  shared_ptr<wallet::CWallet> *local_290;
  undefined1 *local_288;
  undefined1 *local_280;
  char *local_278;
  char *local_270;
  pointer local_268;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_260;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_258;
  undefined1 local_250 [16];
  shared_ptr<wallet::CWallet> wallet;
  assertion_result local_230;
  __atomic_float<double> local_218;
  time_point local_208;
  DebugLogHelper logHelper;
  __node_base_ptr local_1a8;
  atomic<unsigned_long> aStack_1a0;
  _Base_ptr local_198;
  _Alloc_hider local_190;
  _Base_ptr local_188;
  undefined1 local_180 [8];
  WalletDescriptor wallet_descriptor;
  undefined1 local_88 [48];
  string desc;
  
  lVar2 = *(long *)(in_FS_OFFSET + 0x28);
  local_88._24_8_ = local_88 + 8;
  local_88._0_8_ = 0;
  local_88._8_8_ = 0;
  local_88._16_8_ = (_Base_ptr)0x0;
  local_88._40_8_ = 0;
  records._M_t._M_impl._4_4_ = in_stack_fffffffffffffc1c;
  records._M_t._M_impl._0_4_ = in_stack_fffffffffffffc18;
  records._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ = in_stack_fffffffffffffc20;
  records._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)in_stack_fffffffffffffc28;
  records._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       (_Base_ptr)in_stack_fffffffffffffc30;
  records._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       (_Base_ptr)in_stack_fffffffffffffc38;
  records._M_t._M_impl.super__Rb_tree_header._M_node_count = in_stack_fffffffffffffc40;
  local_88._32_8_ = local_88._24_8_;
  CreateMockableWalletDatabase((wallet *)&local_258,records);
  std::
  _Rb_tree<std::vector<std::byte,_zero_after_free_allocator<std::byte>_>,_std::pair<const_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>,_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>_>,_std::_Select1st<std::pair<const_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>,_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>_>_>,_std::less<void>,_std::allocator<std::pair<const_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>,_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>_>_>_>
  ::~_Rb_tree((_Rb_tree<std::vector<std::byte,_zero_after_free_allocator<std::byte>_>,_std::pair<const_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>,_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>_>,_std::_Select1st<std::pair<const_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>,_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>_>_>,_std::less<void>,_std::allocator<std::pair<const_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>,_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>_>_>_>
               *)local_88);
  p_Var4 = local_258;
  (*local_258->_vptr__Sp_counted_base[0xe])(&wallet,local_258,0);
  wallet.super___shared_ptr<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = p_Var4;
  paVar1 = &logHelper.m_message.field_2;
  logHelper.m_message._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&logHelper,
             "trx(tpubD6NzVbkrYhZ4Y4S7m6Y5s9GD8FqEMBy56AGphZXuagajudVZEnYyBahZMgHNCTJc2at82YX6s8JiL1Lohu5A3v1Ur76qguNH4QVQ7qYrBQx/86\'/1\'/0\'/0/*)#8pn8tzdt"
             ,"");
  desc._M_dataplus._M_p = (pointer)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<wallet::walletload_tests::DummyDescriptor,std::allocator<wallet::walletload_tests::DummyDescriptor>,std::__cxx11::string&>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&desc._M_string_length,
             (DummyDescriptor **)&desc,
             (allocator<wallet::walletload_tests::DummyDescriptor> *)&local_2a8,&logHelper.m_message
            );
  local_268 = desc._M_dataplus._M_p;
  p_Stack_260 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)desc._M_string_length;
  desc._M_dataplus._M_p = (pointer)0x0;
  desc._M_string_length = 0;
  pvVar9 = (iterator)0x0;
  pvVar10 = (iterator)0x0;
  descriptor.super___shared_ptr<Descriptor,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  descriptor.super___shared_ptr<Descriptor,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)&local_268;
  WalletDescriptor::WalletDescriptor(&wallet_descriptor,descriptor,0,0,0,in_stack_fffffffffffffc18);
  if (p_Stack_260 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_260);
  }
  if (desc._M_string_length != 0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)desc._M_string_length);
  }
  local_278 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/test/walletload_tests.cpp"
  ;
  local_270 = "";
  local_288 = &boost::unit_test::basic_cstring<char_const>::null;
  local_280 = &boost::unit_test::basic_cstring<char_const>::null;
  file.m_end = (iterator)0x30;
  file.m_begin = (iterator)&local_278;
  msg.m_end = pvVar10;
  msg.m_begin = pvVar9;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)&local_288,msg);
  desc.field_2._M_allocated_capacity = 0;
  desc.field_2._8_8_ = 0;
  desc._M_dataplus._M_p = (pointer)0x0;
  desc._M_string_length = 0;
  _cVar11 = 0x818dc1;
  rVar6.super_class_property<bool>.value =
       (class_property<bool>)
       WalletBatch::WriteDescriptor((WalletBatch *)&wallet,(uint256 *)&desc,&wallet_descriptor);
  local_230.m_message.px = (element_type *)0x0;
  local_230.m_message.pn.pi_ = (sp_counted_base *)0x0;
  wallet_1.super___shared_ptr<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)anon_var_dwarf_25d367d;
  wallet_1.super___shared_ptr<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0xf8f514;
  local_2a8.m_message.px = (element_type *)((ulong)local_2a8.m_message.px & 0xffffffffffffff00);
  local_2a8._0_8_ = &PTR__lazy_ostream_013ae1c8;
  local_2a8.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_2c8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/test/walletload_tests.cpp"
  ;
  local_2c0 = "";
  pvVar9 = (iterator)0x1;
  pvVar10 = (iterator)0x0;
  local_290 = &wallet_1;
  local_230.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(readonly_property<bool>)rVar6.super_class_property<bool>.value;
  boost::test_tools::tt_detail::report_assertion
            (&local_230,(lazy_ostream *)&local_2a8,1,0,WARN,_cVar11,(size_t)&local_2c8,0x30);
  boost::detail::shared_count::~shared_count(&local_230.m_message.pn);
  local_2d8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/test/walletload_tests.cpp"
  ;
  local_2d0 = "";
  local_2e8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_2e0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_00.m_end = (iterator)0x31;
  file_00.m_begin = (iterator)&local_2d8;
  msg_00.m_end = pvVar10;
  msg_00.m_begin = pvVar9;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_00,(size_t)&local_2e8,
             msg_00);
  desc.field_2._M_allocated_capacity = 0;
  desc.field_2._8_8_ = 0;
  desc._M_dataplus._M_p = (pointer)0x0;
  desc._M_string_length = 0;
  _cVar11 = 0x818eab;
  local_230.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)
       WalletBatch::WriteActiveScriptPubKeyMan((WalletBatch *)&wallet,'\x04',(uint256 *)&desc,false)
  ;
  local_230.m_message.px = (element_type *)0x0;
  local_230.m_message.pn.pi_ = (sp_counted_base *)0x0;
  wallet_1.super___shared_ptr<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)anon_var_dwarf_25d3696;
  wallet_1.super___shared_ptr<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0xf8f572;
  local_2a8.m_message.px = (element_type *)((ulong)local_2a8.m_message.px & 0xffffffffffffff00);
  local_2a8._0_8_ = &PTR__lazy_ostream_013ae1c8;
  local_2a8.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_2f8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/test/walletload_tests.cpp"
  ;
  local_2f0 = "";
  pvVar9 = (iterator)0x1;
  pvVar10 = (iterator)0x0;
  local_290 = &wallet_1;
  boost::test_tools::tt_detail::report_assertion
            (&local_230,(lazy_ostream *)&local_2a8,1,0,WARN,_cVar11,(size_t)&local_2f8,0x31);
  boost::detail::shared_count::~shared_count(&local_230.m_message.pn);
  std::
  _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_CExtPubKey>,_std::allocator<std::pair<const_unsigned_int,_CExtPubKey>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::~_Hashtable(&wallet_descriptor.cache.m_last_hardened_xpubs._M_h);
  std::
  _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_CExtPubKey>,_std::allocator<std::pair<const_unsigned_int,_CExtPubKey>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::~_Hashtable(&wallet_descriptor.cache.m_parent_xpubs._M_h);
  std::
  _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_std::unordered_map<unsigned_int,_CExtPubKey,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_CExtPubKey>_>_>_>,_std::allocator<std::pair<const_unsigned_int,_std::unordered_map<unsigned_int,_CExtPubKey,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_CExtPubKey>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::~_Hashtable((_Hashtable<unsigned_int,_std::pair<const_unsigned_int,_std::unordered_map<unsigned_int,_CExtPubKey,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_CExtPubKey>_>_>_>,_std::allocator<std::pair<const_unsigned_int,_std::unordered_map<unsigned_int,_CExtPubKey,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_CExtPubKey>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                 *)&wallet_descriptor.cache);
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
      CONCAT71(wallet_descriptor.descriptor.
               super___shared_ptr<Descriptor,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._1_7_,
               wallet_descriptor.descriptor.
               super___shared_ptr<Descriptor,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._0_1_)
      != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               CONCAT71(wallet_descriptor.descriptor.
                        super___shared_ptr<Descriptor,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
                        ._1_7_,wallet_descriptor.descriptor.
                               super___shared_ptr<Descriptor,_(__gnu_cxx::_Lock_policy)2>.
                               _M_refcount._M_pi._0_1_));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)logHelper.m_message._M_dataplus._M_p != paVar1) {
    operator_delete(logHelper.m_message._M_dataplus._M_p,
                    logHelper.m_message.field_2._M_allocated_capacity + 1);
  }
  if (wallet.super___shared_ptr<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
      (element_type *)0x0) {
    (*((wallet.super___shared_ptr<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
      super_WalletStorage)._vptr_WalletStorage[5])();
  }
  pCVar8 = (CWallet *)operator_new(0x4a8);
  pCVar3 = (this->super_TestingSetup).super_ChainTestingSetup.super_BasicTestingSetup.m_node.chain.
           _M_t.super___uniq_ptr_impl<interfaces::Chain,_std::default_delete<interfaces::Chain>_>.
           _M_t.super__Tuple_impl<0UL,_interfaces::Chain_*,_std::default_delete<interfaces::Chain>_>
           .super__Head_base<0UL,_interfaces::Chain_*,_false>._M_head_impl;
  wallet_descriptor.descriptor.super___shared_ptr<Descriptor,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)&wallet_descriptor.id;
  std::__cxx11::string::_M_construct<char_const*>((string *)&wallet_descriptor,"","");
  local_300 = local_258;
  local_258 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  CWallet::CWallet(pCVar8,pCVar3,(string *)&wallet_descriptor,
                   (unique_ptr<wallet::WalletDatabase,_std::default_delete<wallet::WalletDatabase>_>
                   )&local_300);
  wallet.super___shared_ptr<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2>._M_ptr = pCVar8;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<wallet::CWallet*>
            (&wallet.super___shared_ptr<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
             pCVar8);
  if (local_300 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    (*local_300->_vptr__Sp_counted_base[1])();
  }
  local_300 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  if ((uint256 *)
      wallet_descriptor.descriptor.super___shared_ptr<Descriptor,_(__gnu_cxx::_Lock_policy)2>._M_ptr
      != &wallet_descriptor.id) {
    operator_delete(wallet_descriptor.descriptor.
                    super___shared_ptr<Descriptor,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                    wallet_descriptor.id.super_base_blob<256U>.m_data._M_elems._0_8_ + 1);
  }
  local_310 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/test/walletload_tests.cpp"
  ;
  local_308 = "";
  local_320 = &boost::unit_test::basic_cstring<char_const>::null;
  local_318 = &boost::unit_test::basic_cstring<char_const>::null;
  file_01.m_end = (iterator)0x37;
  file_01.m_begin = (iterator)&local_310;
  msg_01.m_end = pvVar10;
  msg_01.m_begin = pvVar9;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_01,(size_t)&local_320,
             msg_01);
  desc._M_string_length = desc._M_string_length & 0xffffffffffffff00;
  desc._M_dataplus._M_p = "B";
  desc.field_2._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  desc.field_2._8_8_ = (long)"\x05\x04\x03\x02\x01" + 5;
  local_250._0_4_ =
       CWallet::LoadWallet(wallet.super___shared_ptr<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2>.
                           _M_ptr);
  wallet_1.super___shared_ptr<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)local_250;
  local_2a8.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(readonly_property<bool>)(local_250._0_4_ == UNKNOWN_DESCRIPTOR);
  local_250._8_8_ = &local_324;
  local_324 = 6;
  local_2a8.m_message.px = (element_type *)0x0;
  local_2a8.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_230._0_8_ =
       "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/test/walletload_tests.cpp"
  ;
  local_230.m_message.px = (element_type *)0xf8f43c;
  wallet_descriptor.descriptor.super___shared_ptr<Descriptor,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi._0_1_ = 0;
  wallet_descriptor.descriptor.super___shared_ptr<Descriptor,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)&PTR__lazy_ostream_013b5388;
  wallet_descriptor.id.super_base_blob<256U>.m_data._M_elems._0_8_ =
       boost::unit_test::lazy_ostream::inst;
  wallet_descriptor.id.super_base_blob<256U>.m_data._M_elems._8_8_ = &wallet_1;
  logHelper.m_message.field_2._8_8_ = local_250 + 8;
  logHelper.m_message._M_string_length._0_1_ = 0;
  logHelper.m_message._M_dataplus._M_p = "B";
  logHelper.m_message.field_2._M_allocated_capacity =
       (size_type)boost::unit_test::lazy_ostream::inst;
  boost::test_tools::tt_detail::report_assertion
            (&local_2a8,(lazy_ostream *)&desc,1,2,REQUIRE,0xf8df2b,(size_t)&local_230,0x37,
             &wallet_descriptor,"DBErrors::UNKNOWN_DESCRIPTOR",&logHelper);
  boost::detail::shared_count::~shared_count(&local_2a8.m_message.pn);
  if (wallet.super___shared_ptr<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (wallet.super___shared_ptr<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  local_190._M_p = (pointer)&aStack_1a0;
  local_1a8 = (__node_base_ptr)0x0;
  aStack_1a0.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0;
  local_198 = (_Base_ptr)0x0;
  local_180 = (undefined1  [8])0x0;
  records_00._M_t._M_impl._4_4_ = in_stack_fffffffffffffc1c;
  records_00._M_t._M_impl._0_4_ = in_stack_fffffffffffffc18;
  records_00._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ = in_stack_fffffffffffffc20;
  records_00._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)in_stack_fffffffffffffc28;
  records_00._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       (_Base_ptr)in_stack_fffffffffffffc30;
  records_00._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       (_Base_ptr)in_stack_fffffffffffffc38;
  records_00._M_t._M_impl.super__Rb_tree_header._M_node_count = in_stack_fffffffffffffc40;
  local_188 = (_Base_ptr)local_190._M_p;
  CreateMockableWalletDatabase((wallet *)&wallet_descriptor,records_00);
  peVar5 = wallet_descriptor.descriptor.super___shared_ptr<Descriptor,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  p_Var4 = local_258;
  wallet_descriptor.descriptor.super___shared_ptr<Descriptor,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  local_258 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)peVar5;
  if (p_Var4 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    (**(code **)(*(long *)p_Var4 + 8))();
    if (wallet_descriptor.descriptor.super___shared_ptr<Descriptor,_(__gnu_cxx::_Lock_policy)2>.
        _M_ptr != (element_type *)0x0) {
      (*(wallet_descriptor.descriptor.super___shared_ptr<Descriptor,_(__gnu_cxx::_Lock_policy)2>.
        _M_ptr)->_vptr_Descriptor[1])();
    }
  }
  wallet_descriptor.descriptor.super___shared_ptr<Descriptor,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  std::
  _Rb_tree<std::vector<std::byte,_zero_after_free_allocator<std::byte>_>,_std::pair<const_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>,_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>_>,_std::_Select1st<std::pair<const_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>,_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>_>_>,_std::less<void>,_std::allocator<std::pair<const_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>,_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>_>_>_>
  ::~_Rb_tree((_Rb_tree<std::vector<std::byte,_zero_after_free_allocator<std::byte>_>,_std::pair<const_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>,_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>_>,_std::_Select1st<std::pair<const_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>,_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>_>_>,_std::less<void>,_std::allocator<std::pair<const_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>,_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>_>_>_>
               *)&local_1a8);
  found = false;
  local_218._M_fp = (double)&local_208;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_218,
             "The descriptor ID calculated by the wallet differs from the one in DB","");
  local_340 = 0;
  local_348 = &found;
  local_330 = std::
              _Function_handler<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/test/walletload_tests.cpp:65:103)>
              ::_M_invoke;
  local_338 = std::
              _Function_handler<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/test/walletload_tests.cpp:65:103)>
              ::_M_manager;
  message._M_dataplus._M_p._4_4_ = in_stack_fffffffffffffc1c;
  message._M_dataplus._M_p._0_4_ = in_stack_fffffffffffffc18;
  message._M_string_length = in_stack_fffffffffffffc20;
  message.field_2._M_allocated_capacity = in_stack_fffffffffffffc28;
  message.field_2._8_8_ = in_stack_fffffffffffffc30;
  match.super__Function_base._M_functor._8_8_ = in_stack_fffffffffffffc40;
  match.super__Function_base._M_functor._M_unused._M_object = (void *)in_stack_fffffffffffffc38;
  match.super__Function_base._M_manager._0_4_ = in_stack_fffffffffffffc48;
  match.super__Function_base._M_manager._4_4_ = in_stack_fffffffffffffc4c;
  match._M_invoker = in_stack_fffffffffffffc50;
  DebugLogHelper::DebugLogHelper(&logHelper,message,match);
  if (local_338 != (code *)0x0) {
    (*local_338)(&local_348,&local_348,3);
  }
  if ((time_point *)local_218._M_fp != &local_208) {
    operator_delete((void *)local_218._M_fp,(long)local_208.__d.__r + 1);
  }
  p_Var4 = local_258;
  (*local_258->_vptr__Sp_counted_base[0xe])(&wallet,local_258,0);
  wallet.super___shared_ptr<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = p_Var4;
  desc._M_dataplus._M_p = (pointer)&desc.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&desc,
             "wpkh([d34db33f/84h/0h/0h]xpub6DJ2dNUysrn5Vt36jH2KLBT2i1auw1tTSSomg8PhqNiUtx8QX2SvC9nrHu81fT41fvDUnhMjEzQgXnQjKEu3oaqMSzhSrHMxyyoEAmUHQbY/0/*)#cjjspncu"
             ,"");
  local_2a8._0_8_ = (DummyDescriptor *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<wallet::walletload_tests::DummyDescriptor,std::allocator<wallet::walletload_tests::DummyDescriptor>,std::__cxx11::string&>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_2a8.m_message,
             (DummyDescriptor **)&local_2a8,
             (allocator<wallet::walletload_tests::DummyDescriptor> *)&local_230,&desc);
  local_358 = (DummyDescriptor *)local_2a8._0_8_;
  peStack_350 = local_2a8.m_message.px;
  local_2a8.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)0x0;
  local_2a8._1_7_ = 0;
  local_2a8.m_message.px = (element_type *)0x0;
  pvVar9 = (iterator)0x0;
  pvVar10 = (iterator)0x0;
  descriptor_00.super___shared_ptr<Descriptor,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  descriptor_00.super___shared_ptr<Descriptor,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)&local_358;
  WalletDescriptor::WalletDescriptor
            (&wallet_descriptor,descriptor_00,0,0,0,in_stack_fffffffffffffc18);
  if (peStack_350 != (element_type *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)peStack_350);
  }
  if (local_2a8.m_message.px != (element_type *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_2a8.m_message.px);
  }
  local_368 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/test/walletload_tests.cpp"
  ;
  local_360 = "";
  local_378 = &boost::unit_test::basic_cstring<char_const>::null;
  local_370 = &boost::unit_test::basic_cstring<char_const>::null;
  file_02.m_end = (iterator)0x4b;
  file_02.m_begin = (iterator)&local_368;
  msg_02.m_end = pvVar10;
  msg_02.m_begin = pvVar9;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_02,(size_t)&local_378,
             msg_02);
  _cVar11 = 0x819469;
  rVar7.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)
       WalletBatch::WriteDescriptor((WalletBatch *)&wallet,&uint256::ONE,&wallet_descriptor);
  local_230.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       rVar7.super_readonly_property<bool>.super_class_property<bool>.value;
  local_230.m_message.px = (element_type *)0x0;
  local_230.m_message.pn.pi_ = (sp_counted_base *)0x0;
  wallet_1.super___shared_ptr<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)anon_var_dwarf_25d371e;
  wallet_1.super___shared_ptr<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0xf8f6a3;
  local_2a8.m_message.px = (element_type *)((ulong)local_2a8.m_message.px & 0xffffffffffffff00);
  local_2a8._0_8_ = &PTR__lazy_ostream_013ae1c8;
  local_2a8.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_388 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/test/walletload_tests.cpp"
  ;
  local_380 = "";
  pvVar9 = (iterator)0x1;
  pvVar10 = (iterator)0x0;
  local_290 = &wallet_1;
  boost::test_tools::tt_detail::report_assertion
            (&local_230,(lazy_ostream *)&local_2a8,1,0,WARN,_cVar11,(size_t)&local_388,0x4b);
  boost::detail::shared_count::~shared_count(&local_230.m_message.pn);
  std::
  _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_CExtPubKey>,_std::allocator<std::pair<const_unsigned_int,_CExtPubKey>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::~_Hashtable(&wallet_descriptor.cache.m_last_hardened_xpubs._M_h);
  std::
  _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_CExtPubKey>,_std::allocator<std::pair<const_unsigned_int,_CExtPubKey>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::~_Hashtable(&wallet_descriptor.cache.m_parent_xpubs._M_h);
  std::
  _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_std::unordered_map<unsigned_int,_CExtPubKey,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_CExtPubKey>_>_>_>,_std::allocator<std::pair<const_unsigned_int,_std::unordered_map<unsigned_int,_CExtPubKey,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_CExtPubKey>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::~_Hashtable((_Hashtable<unsigned_int,_std::pair<const_unsigned_int,_std::unordered_map<unsigned_int,_CExtPubKey,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_CExtPubKey>_>_>_>,_std::allocator<std::pair<const_unsigned_int,_std::unordered_map<unsigned_int,_CExtPubKey,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_CExtPubKey>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                 *)&wallet_descriptor.cache);
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
      CONCAT71(wallet_descriptor.descriptor.
               super___shared_ptr<Descriptor,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._1_7_,
               wallet_descriptor.descriptor.
               super___shared_ptr<Descriptor,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._0_1_)
      != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               CONCAT71(wallet_descriptor.descriptor.
                        super___shared_ptr<Descriptor,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
                        ._1_7_,wallet_descriptor.descriptor.
                               super___shared_ptr<Descriptor,_(__gnu_cxx::_Lock_policy)2>.
                               _M_refcount._M_pi._0_1_));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)desc._M_dataplus._M_p != &desc.field_2) {
    operator_delete(desc._M_dataplus._M_p,desc.field_2._M_allocated_capacity + 1);
  }
  if (wallet.super___shared_ptr<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
      (element_type *)0x0) {
    (*((wallet.super___shared_ptr<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
      super_WalletStorage)._vptr_WalletStorage[5])();
  }
  pCVar8 = (CWallet *)operator_new(0x4a8);
  pCVar3 = (this->super_TestingSetup).super_ChainTestingSetup.super_BasicTestingSetup.m_node.chain.
           _M_t.super___uniq_ptr_impl<interfaces::Chain,_std::default_delete<interfaces::Chain>_>.
           _M_t.super__Tuple_impl<0UL,_interfaces::Chain_*,_std::default_delete<interfaces::Chain>_>
           .super__Head_base<0UL,_interfaces::Chain_*,_false>._M_head_impl;
  wallet_descriptor.descriptor.super___shared_ptr<Descriptor,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)&wallet_descriptor.id;
  std::__cxx11::string::_M_construct<char_const*>((string *)&wallet_descriptor,"","");
  local_390 = local_258;
  local_258 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  CWallet::CWallet(pCVar8,pCVar3,(string *)&wallet_descriptor,
                   (unique_ptr<wallet::WalletDatabase,_std::default_delete<wallet::WalletDatabase>_>
                   )&local_390);
  wallet_1.super___shared_ptr<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2>._M_ptr = pCVar8;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<wallet::CWallet*>
            (&wallet_1.super___shared_ptr<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
             pCVar8);
  if (local_390 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    (*local_390->_vptr__Sp_counted_base[1])();
  }
  local_390 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  if ((uint256 *)
      wallet_descriptor.descriptor.super___shared_ptr<Descriptor,_(__gnu_cxx::_Lock_policy)2>._M_ptr
      != &wallet_descriptor.id) {
    operator_delete(wallet_descriptor.descriptor.
                    super___shared_ptr<Descriptor,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                    wallet_descriptor.id.super_base_blob<256U>.m_data._M_elems._0_8_ + 1);
  }
  local_3a0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/test/walletload_tests.cpp"
  ;
  local_398 = "";
  file_03.m_end = (iterator)0x51;
  file_03.m_begin = (iterator)&local_3a0;
  msg_03.m_end = pvVar10;
  msg_03.m_begin = pvVar9;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_03,
             (size_t)&stack0xfffffffffffffc50,msg_03);
  local_2a8.m_message.px = (element_type *)((ulong)local_2a8.m_message.px & 0xffffffffffffff00);
  local_2a8._0_8_ = &PTR__lazy_ostream_013ae088;
  local_2a8.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_290 = (shared_ptr<wallet::CWallet> *)0xf73bdc;
  local_324 = CWallet::LoadWallet(wallet_1.
                                  super___shared_ptr<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2>.
                                  _M_ptr);
  local_250._0_8_ = &stack0xfffffffffffffc4c;
  local_230.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(readonly_property<bool>)(local_324 == CORRUPT);
  local_230.m_message.px = (element_type *)0x0;
  local_230.m_message.pn.pi_ = (sp_counted_base *)0x0;
  wallet.super___shared_ptr<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)anon_var_dwarf_25d3632;
  wallet.super___shared_ptr<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0xf8f43c;
  local_250._8_8_ = &local_324;
  wallet_descriptor.descriptor.super___shared_ptr<Descriptor,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi._0_1_ = 0;
  wallet_descriptor.descriptor.super___shared_ptr<Descriptor,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)&PTR__lazy_ostream_013b5388;
  wallet_descriptor.id.super_base_blob<256U>.m_data._M_elems._0_8_ =
       boost::unit_test::lazy_ostream::inst;
  wallet_descriptor.id.super_base_blob<256U>.m_data._M_elems._8_8_ = local_250 + 8;
  desc._M_string_length = desc._M_string_length & 0xffffffffffffff00;
  desc._M_dataplus._M_p = "B";
  desc.field_2._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  desc.field_2._8_8_ = local_250;
  pvVar9 = (iterator)0x1;
  pvVar10 = (iterator)0x2;
  boost::test_tools::tt_detail::report_assertion
            (&local_230,(lazy_ostream *)&local_2a8,1,2,REQUIRE,0xf8df2b,(size_t)&wallet,0x51,
             &wallet_descriptor,"DBErrors::CORRUPT",&desc);
  boost::detail::shared_count::~shared_count(&local_230.m_message.pn);
  _cVar11 = 0x8197d0;
  file_04.m_end = (iterator)0x52;
  file_04.m_begin = &stack0xfffffffffffffc38;
  msg_04.m_end = pvVar10;
  msg_04.m_begin = pvVar9;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_04,
             (size_t)&stack0xfffffffffffffc28,msg_04);
  desc._M_dataplus._M_p._0_1_ = found;
  desc._M_string_length = 0;
  desc.field_2._M_allocated_capacity = 0;
  local_2a8._0_8_ = "found";
  local_2a8.m_message.px = (element_type *)0xfddd22;
  wallet_descriptor.descriptor.super___shared_ptr<Descriptor,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi._0_1_ = 0;
  wallet_descriptor.descriptor.super___shared_ptr<Descriptor,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)&PTR__lazy_ostream_013ae1c8;
  wallet_descriptor.id.super_base_blob<256U>.m_data._M_elems._0_8_ =
       boost::unit_test::lazy_ostream::inst;
  wallet_descriptor.id.super_base_blob<256U>.m_data._M_elems._8_8_ = &local_2a8;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&desc,(lazy_ostream *)&wallet_descriptor,1,0,WARN,_cVar11,
             (size_t)&stack0xfffffffffffffc18,0x52);
  boost::detail::shared_count::~shared_count((shared_count *)&desc.field_2._M_allocated_capacity);
  if (wallet_1.super___shared_ptr<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (wallet_1.super___shared_ptr<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  DebugLogHelper::~DebugLogHelper(&logHelper);
  if (local_258 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    (**(code **)(*(long *)local_258 + 8))();
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar2) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

BOOST_FIXTURE_TEST_CASE(wallet_load_descriptors, TestingSetup)
{
    std::unique_ptr<WalletDatabase> database = CreateMockableWalletDatabase();
    {
        // Write unknown active descriptor
        WalletBatch batch(*database, false);
        std::string unknown_desc = "trx(tpubD6NzVbkrYhZ4Y4S7m6Y5s9GD8FqEMBy56AGphZXuagajudVZEnYyBahZMgHNCTJc2at82YX6s8JiL1Lohu5A3v1Ur76qguNH4QVQ7qYrBQx/86'/1'/0'/0/*)#8pn8tzdt";
        WalletDescriptor wallet_descriptor(std::make_shared<DummyDescriptor>(unknown_desc), 0, 0, 0, 0);
        BOOST_CHECK(batch.WriteDescriptor(uint256(), wallet_descriptor));
        BOOST_CHECK(batch.WriteActiveScriptPubKeyMan(static_cast<uint8_t>(OutputType::UNKNOWN), uint256(), false));
    }

    {
        // Now try to load the wallet and verify the error.
        const std::shared_ptr<CWallet> wallet(new CWallet(m_node.chain.get(), "", std::move(database)));
        BOOST_CHECK_EQUAL(wallet->LoadWallet(), DBErrors::UNKNOWN_DESCRIPTOR);
    }

    // Test 2
    // Now write a valid descriptor with an invalid ID.
    // As the software produces another ID for the descriptor, the loading process must be aborted.
    database = CreateMockableWalletDatabase();

    // Verify the error
    bool found = false;
    DebugLogHelper logHelper("The descriptor ID calculated by the wallet differs from the one in DB", [&](const std::string* s) {
        found = true;
        return false;
    });

    {
        // Write valid descriptor with invalid ID
        WalletBatch batch(*database, false);
        std::string desc = "wpkh([d34db33f/84h/0h/0h]xpub6DJ2dNUysrn5Vt36jH2KLBT2i1auw1tTSSomg8PhqNiUtx8QX2SvC9nrHu81fT41fvDUnhMjEzQgXnQjKEu3oaqMSzhSrHMxyyoEAmUHQbY/0/*)#cjjspncu";
        WalletDescriptor wallet_descriptor(std::make_shared<DummyDescriptor>(desc), 0, 0, 0, 0);
        BOOST_CHECK(batch.WriteDescriptor(uint256::ONE, wallet_descriptor));
    }

    {
        // Now try to load the wallet and verify the error.
        const std::shared_ptr<CWallet> wallet(new CWallet(m_node.chain.get(), "", std::move(database)));
        BOOST_CHECK_EQUAL(wallet->LoadWallet(), DBErrors::CORRUPT);
        BOOST_CHECK(found); // The error must be logged
    }
}